

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_format_one_pixel(void *src,rf_uncompressed_pixel_format src_format,void *dst,
                        rf_uncompressed_pixel_format dst_format)

{
  ushort uVar1;
  rf_color rVar2;
  uint uVar3;
  size_t __n;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  rf_vec4 rVar9;
  float local_48;
  float fStack_44;
  float fStack_34;
  
  uVar4 = src_format - RF_UNCOMPRESSED_GRAYSCALE;
  uVar3 = dst_format - RF_UNCOMPRESSED_GRAYSCALE;
  if ((uVar3 < 10 && uVar4 < 10) && src_format == dst_format) {
    if (uVar4 < 10) {
      __n = *(size_t *)(&DAT_0017bf58 + (ulong)uVar4 * 8);
    }
    else {
      __n = 0;
    }
    memcpy(dst,src,__n);
    return;
  }
  if (dst_format == RF_UNCOMPRESSED_NORMALIZED && uVar4 < 10) {
switchD_0011fe16_caseD_9:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    *(rf_vec4 *)dst = rVar9;
    return;
  }
  if (dst_format == RF_UNCOMPRESSED_R8G8B8A8 && uVar4 < 10) {
    rVar2 = rf_format_one_pixel_to_rgba32(src,src_format);
    *(rf_color *)dst = rVar2;
    return;
  }
  if (9 < uVar3 || 9 < uVar4) {
    return;
  }
  switch(uVar3) {
  case 0:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    *(char *)dst = (char)(int)((rVar9.z * 0.114 + rVar9.x * 0.299 + rVar9.y * 0.587) * 255.0);
    break;
  case 1:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    *(char *)dst = (char)(int)((rVar9.z * 0.114 + rVar9.x * 0.299 + rVar9.y * 0.587) * 255.0);
    *(char *)((long)dst + 1) = (char)(int)(rVar9.w * 255.0);
    break;
  case 2:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    fVar5 = roundf(rVar9.x * 31.0);
    fStack_34 = rVar9.y;
    fVar6 = roundf(fStack_34 * 63.0);
    local_48 = rVar9.z;
    fVar7 = roundf(local_48 * 31.0);
    uVar1 = (ushort)(int)fVar7 & 0xff | (ushort)((int)fVar5 << 0xb) |
            (ushort)(((int)fVar6 & 0xffU) << 5);
    goto LAB_001200db;
  case 3:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    *(char *)dst = (char)(int)(rVar9.x * 255.0);
    *(char *)((long)dst + 1) = (char)(int)(rVar9.y * 255.0);
    *(char *)((long)dst + 2) = (char)(int)(rVar9.z * 255.0);
    break;
  case 4:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    fVar5 = roundf(rVar9.x * 31.0);
    fStack_34 = rVar9.y;
    fVar6 = roundf(fStack_34 * 31.0);
    local_48 = rVar9.z;
    fVar7 = roundf(local_48 * 31.0);
    fStack_44 = rVar9.w;
    *(ushort *)dst =
         (ushort)(0.19607843 < fStack_44) | (ushort)(((int)fVar6 & 0xffU) << 6) |
         ((ushort)(int)fVar7 & 0xff) * 2 | (ushort)((int)fVar5 << 0xb);
    break;
  case 5:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    fVar5 = roundf(rVar9.x * 15.0);
    fStack_34 = rVar9.y;
    fVar6 = roundf(fStack_34 * 15.0);
    local_48 = rVar9.z;
    fVar7 = roundf(local_48 * 15.0);
    fStack_44 = rVar9.w;
    fVar8 = roundf(fStack_44 * 15.0);
    uVar1 = (ushort)(int)fVar8 & 0xff | (ushort)((int)fVar6 << 8) | (ushort)((int)fVar5 << 0xc) |
            (ushort)(((int)fVar7 & 0xffU) << 4);
LAB_001200db:
    *(ushort *)dst = uVar1;
    break;
  case 6:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    *(char *)dst = (char)(int)(rVar9.x * 255.0);
    *(char *)((long)dst + 1) = (char)(int)(rVar9.y * 255.0);
    *(char *)((long)dst + 2) = (char)(int)(rVar9.z * 255.0);
    *(char *)((long)dst + 3) = (char)(int)(rVar9.w * 255.0);
    break;
  case 7:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    *(float *)dst = rVar9.z * 0.114 + rVar9.x * 0.299 + rVar9.y * 0.587;
    break;
  case 8:
    rVar9 = rf_format_one_pixel_to_normalized(src,src_format);
    *(float *)dst = rVar9.x;
    *(float *)((long)dst + 4) = rVar9.y;
    *(float *)((long)dst + 8) = rVar9.z;
    break;
  case 9:
    goto switchD_0011fe16_caseD_9;
  }
  return;
}

Assistant:

RF_API void rf_format_one_pixel(const void* src, rf_uncompressed_pixel_format src_format, void* dst, rf_uncompressed_pixel_format dst_format)
{
    if (src_format == dst_format && rf_is_uncompressed_format(src_format) && rf_is_uncompressed_format(dst_format))
    {
        memcpy(dst, src, rf_bytes_per_pixel(src_format));
    }
    else if (rf_is_uncompressed_format(src_format) && dst_format == RF_UNCOMPRESSED_R32G32B32A32)
    {
        *((rf_vec4*)dst) = rf_format_one_pixel_to_normalized(src, src_format);
    }
    else if (rf_is_uncompressed_format(src_format) && dst_format == RF_UNCOMPRESSED_R8G8B8A8)
    {
        *((rf_color*)dst) = rf_format_one_pixel_to_rgba32(src, src_format);
    }
    else if (rf_is_uncompressed_format(src_format) && rf_is_uncompressed_format(dst_format))
    {
        switch (dst_format)
        {
            case RF_UNCOMPRESSED_GRAYSCALE:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0] = (unsigned char)((normalized.x * 0.299f + normalized.y * 0.587f + normalized.z * 0.114f) * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_GRAY_ALPHA:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0    ] = (unsigned char)((normalized.x * 0.299f + (float)normalized.y * 0.587f + (float)normalized.z * 0.114f) * 255.0f);
                ((unsigned char*)dst)[0 + 1] = (unsigned char) (normalized.w * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_R5G6B5:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                unsigned char r = (unsigned char)(round(normalized.x * 31.0f));
                unsigned char g = (unsigned char)(round(normalized.y * 63.0f));
                unsigned char b = (unsigned char)(round(normalized.z * 31.0f));

                ((unsigned short*)dst)[0] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
            }
            break;

            case RF_UNCOMPRESSED_R8G8B8:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0    ] = (unsigned char)(normalized.x * 255.0f);
                ((unsigned char*)dst)[0 + 1] = (unsigned char)(normalized.y * 255.0f);
                ((unsigned char*)dst)[0 + 2] = (unsigned char)(normalized.z * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_R5G5B5A1:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                int ALPHA_THRESHOLD = 50;
                unsigned char r = (unsigned char)(round(normalized.x * 31.0f));
                unsigned char g = (unsigned char)(round(normalized.y * 31.0f));
                unsigned char b = (unsigned char)(round(normalized.z * 31.0f));
                unsigned char a = (normalized.w > ((float)ALPHA_THRESHOLD / 255.0f)) ? 1 : 0;

                ((unsigned short*)dst)[0] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
            }
            break;

            case RF_UNCOMPRESSED_R4G4B4A4:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                unsigned char r = (unsigned char)(round(normalized.x * 15.0f));
                unsigned char g = (unsigned char)(round(normalized.y * 15.0f));
                unsigned char b = (unsigned char)(round(normalized.z * 15.0f));
                unsigned char a = (unsigned char)(round(normalized.w * 15.0f));

                ((unsigned short*)dst)[0] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
            }
            break;

            case RF_UNCOMPRESSED_R8G8B8A8:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((unsigned char*)dst)[0    ] = (unsigned char)(normalized.x * 255.0f);
                ((unsigned char*)dst)[0 + 1] = (unsigned char)(normalized.y * 255.0f);
                ((unsigned char*)dst)[0 + 2] = (unsigned char)(normalized.z * 255.0f);
                ((unsigned char*)dst)[0 + 3] = (unsigned char)(normalized.w * 255.0f);
            }
            break;

            case RF_UNCOMPRESSED_R32:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((float*)dst)[0] = (float)(normalized.x * 0.299f + normalized.y * 0.587f + normalized.z * 0.114f);
            }
            break;

            case RF_UNCOMPRESSED_R32G32B32:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((float*)dst)[0    ] = normalized.x;
                ((float*)dst)[0 + 1] = normalized.y;
                ((float*)dst)[0 + 2] = normalized.z;
            }
            break;

            case RF_UNCOMPRESSED_R32G32B32A32:
            {
                rf_vec4 normalized = rf_format_one_pixel_to_normalized(src, src_format);
                ((float*)dst)[0    ] = normalized.x;
                ((float*)dst)[0 + 1] = normalized.y;
                ((float*)dst)[0 + 2] = normalized.z;
                ((float*)dst)[0 + 3] = normalized.w;
            }
            break;

            default: break;
        }
    }
}